

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseVar(WastParser *this,Var *out_var)

{
  ulong uVar1;
  char *s;
  Location loc;
  TokenType TVar2;
  Result RVar3;
  Literal *pLVar4;
  long lVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  string_view name;
  allocator<char> local_b1;
  uint64_t index;
  Token token;
  undefined1 local_68 [64];
  undefined1 local_28 [8];
  
  TVar2 = Peek(this,0);
  if (TVar2 == Last_Literal) {
    Consume(&token,this);
    pLVar4 = Token::literal(&token);
    uVar1 = (pLVar4->text)._M_len;
    s = (pLVar4->text)._M_str;
    index = 0xffffffff;
    RVar3 = ParseUint64(s,s + uVar1,&index);
    if (RVar3.enum_ == Error) {
      loc.filename._M_str._0_4_ = token.loc.filename._M_str._0_4_;
      loc.filename._M_len = token.loc.filename._M_len;
      loc.filename._M_str._4_4_ = token.loc.filename._M_str._4_4_;
      loc.field_1.field_0.line = token.loc.field_1.field_0.line;
      loc.field_1.field_0.first_column = token.loc.field_1.field_0.first_column;
      loc.field_1.field_0.last_column = token.loc.field_1.field_0.last_column;
      loc.field_1._12_4_ = token.loc.field_1._12_4_;
      Error(this,loc,"invalid int \"%.*s\"",uVar1 & 0xffffffff,s,in_R8,in_R9);
    }
    Var::Var((Var *)local_68,(Index)index,&token.loc);
    Var::operator=(out_var,(Var *)local_68);
    Var::~Var((Var *)local_68);
    RVar3.enum_ = Ok;
  }
  else {
    RVar3.enum_ = Ok;
    TVar2 = Peek(this,0);
    if (TVar2 == Last_String) {
      Consume(&token,this);
      name = Token::text(&token);
      Var::Var((Var *)local_68,name,&token.loc);
      Var::operator=(out_var,(Var *)local_68);
      Var::~Var((Var *)local_68);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_68,"a numeric index",(allocator<char> *)&index);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_68 + 0x20),"a name",&local_b1);
      token.loc.filename._M_len = 0;
      token.loc.filename._M_str = (char *)0x0;
      token.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&token,
                 (string *)local_68,local_28);
      RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&token,"12 or $foo");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&token);
      lVar5 = 0x20;
      do {
        std::__cxx11::string::_M_dispose();
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
    }
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result WastParser::ParseVar(Var* out_var) {
  WABT_TRACE(ParseVar);
  if (PeekMatch(TokenType::Nat)) {
    Token token = Consume();
    std::string_view sv = token.literal().text;
    uint64_t index = kInvalidIndex;
    if (Failed(ParseUint64(sv, &index))) {
      // Print an error, but don't fail parsing.
      Error(token.loc, "invalid int \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    *out_var = Var(index, token.loc);
    return Result::Ok;
  } else if (PeekMatch(TokenType::Var)) {
    Token token = Consume();
    *out_var = Var(token.text(), token.loc);
    return Result::Ok;
  } else {
    return ErrorExpected({"a numeric index", "a name"}, "12 or $foo");
  }
}